

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Input::mapTag(Input *this,StringRef Tag,bool Default)

{
  int iVar1;
  undefined1 local_48 [8];
  string foundTag;
  
  if (this->CurrentNode == (HNode *)0x0) {
    Default = false;
  }
  else {
    Node::getVerbatimTag_abi_cxx11_((string *)local_48,this->CurrentNode->_node);
    if (foundTag._M_dataplus._M_p != (pointer)0x0) {
      if (foundTag._M_dataplus._M_p == (pointer)Tag.Length) {
        iVar1 = bcmp(Tag.Data,(void *)local_48,(size_t)foundTag._M_dataplus._M_p);
        Default = iVar1 == 0;
      }
      else {
        Default = false;
      }
    }
    if (local_48 != (undefined1  [8])&foundTag._M_string_length) {
      operator_delete((void *)local_48,foundTag._M_string_length + 1);
    }
  }
  return Default;
}

Assistant:

bool Input::mapTag(StringRef Tag, bool Default) {
  // CurrentNode can be null if setCurrentDocument() was unable to
  // parse the document because it was invalid or empty.
  if (!CurrentNode)
    return false;

  std::string foundTag = CurrentNode->_node->getVerbatimTag();
  if (foundTag.empty()) {
    // If no tag found and 'Tag' is the default, say it was found.
    return Default;
  }
  // Return true iff found tag matches supplied tag.
  return Tag.equals(foundTag);
}